

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_transform_abi_cxx11_
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,collate_impl<wchar_t> *this,level_type level,wchar_t *b,
          wchar_t *e)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  do_basic_transform((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,this,level,b
                     ,e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((wstring *)__return_storage_ptr__,local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType> do_transform(level_type level,CharType const *b,CharType const *e) const
                {
                    std::vector<uint8_t> tmp = do_basic_transform(level,b,e);
                    return std::basic_string<CharType>(tmp.begin(),tmp.end());
                }